

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

char * attr_string_from_atom(atom_t atom)

{
  char *pcVar1;
  char *tmp;
  atom_t in_stack_00000074;
  atom_server in_stack_00000078;
  
  atl_lock();
  init_global_atom_server((atom_server *)0x107639);
  pcVar1 = string_from_atom(in_stack_00000078,in_stack_00000074);
  atl_unlock();
  return pcVar1;
}

Assistant:

extern
char *
attr_string_from_atom(atom_t atom)
{
    char *tmp;
    atl_lock();
    init_global_atom_server(&global_as);
    tmp = string_from_atom(global_as, atom);
    atl_unlock();
    return tmp;
}